

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O1

size_t argparse::details::
       get_levenshtein_distance<std::basic_string_view<char,std::char_traits<char>>>
                 (basic_string_view<char,_std::char_traits<char>_> *s1,
                 basic_string_view<char,_std::char_traits<char>_> *s2)

{
  pointer pvVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  pointer puVar5;
  pointer puVar6;
  size_t i;
  ulong uVar7;
  size_t j;
  ulong uVar8;
  long lVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar10;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  dp;
  allocator_type local_6a;
  allocator_type local_69;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  value_type_conflict1 local_50;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_48;
  
  sVar2 = s1->_M_len;
  local_50 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_68,s2->_M_len + 1,&local_50,&local_69);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_48,sVar2 + 1,&local_68,&local_6a);
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar7 = 0;
  do {
    pcVar3 = s1->_M_str;
    pcVar4 = s2->_M_str;
    pvVar1 = local_48.
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar7;
    uVar8 = 0;
    do {
      if (uVar7 == 0) {
        ((local_48.
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar8] = uVar8;
      }
      else if (uVar8 == 0) {
        *(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_start = uVar7;
      }
      else if (pcVar3[uVar7 - 1] == pcVar4[uVar8 - 1]) {
        (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar8] =
             local_48.
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar7 - 1].
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8 - 1];
      }
      else {
        puVar5 = local_48.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7 - 1].
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)puVar5[uVar8];
        puVar6 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)puVar6[uVar8 - 1];
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)puVar5[uVar8 - 1];
        lVar9 = 8;
        pvVar10 = &local_68;
        do {
          if (*(pointer *)
               ((long)&local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar9) <
              (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start) {
            pvVar10 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      ((long)&local_68.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar9);
          }
          lVar9 = lVar9 + 8;
        } while (lVar9 != 0x18);
        puVar6[uVar8] =
             (long)(pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 <= s2->_M_len);
    uVar7 = uVar7 + 1;
  } while (uVar7 <= s1->_M_len);
  sVar2 = local_48.
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[s1->_M_len].
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[s2->_M_len];
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_48);
  return sVar2;
}

Assistant:

std::size_t get_levenshtein_distance(const StringType &s1,
                                     const StringType &s2) {
  std::vector<std::vector<std::size_t>> dp(
      s1.size() + 1, std::vector<std::size_t>(s2.size() + 1, 0));

  for (std::size_t i = 0; i <= s1.size(); ++i) {
    for (std::size_t j = 0; j <= s2.size(); ++j) {
      if (i == 0) {
        dp[i][j] = j;
      } else if (j == 0) {
        dp[i][j] = i;
      } else if (s1[i - 1] == s2[j - 1]) {
        dp[i][j] = dp[i - 1][j - 1];
      } else {
        dp[i][j] = 1 + std::min({dp[i - 1][j], dp[i][j - 1], dp[i - 1][j - 1]});
      }
    }
  }

  return dp[s1.size()][s2.size()];
}